

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void cloudClearMark(CloudManager *dd,CloudNode *n)

{
  uint uVar1;
  
  uVar1 = dd->bitsNode;
  while (((uVar1 >> 0x1c & 1) != 0 &&
         (dd->bitsNode = uVar1 & 0xefffffff, (uVar1 & 0xefffffff) != 0xfffffff))) {
    cloudClearMark(*(CloudManager **)(dd->bitsCache + 2),n);
    dd = (CloudManager *)(*(ulong *)dd->bitsCache & 0xfffffffffffffffe);
    uVar1 = dd->bitsNode;
  }
  return;
}

Assistant:

static void cloudClearMark( CloudManager * dd, CloudNode * n )
{
    if ( !cloudNodeIsMarked(n) )
        return;
    // clear visited flag
    cloudNodeUnmark(n);
    if ( cloudIsConstant(n) )
        return;
    cloudClearMark( dd, cloudT(n) );
    cloudClearMark( dd, Cloud_Regular(cloudE(n)) );
}